

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O2

Exception * kj::Timer::makeTimeoutException(void)

{
  char (*in_RCX) [20];
  Exception *in_RDI;
  Array<char> AStack_28;
  
  kj::_::Debug::makeDescription<char_const(&)[20]>
            ((String *)&AStack_28,(Debug *)"\"operation timed out\"","operation timed out",in_RCX);
  Exception::Exception
            (in_RDI,OVERLOADED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/timer.c++"
             ,0x1e,(String *)&AStack_28);
  Array<char>::~Array(&AStack_28);
  return in_RDI;
}

Assistant:

kj::Exception Timer::makeTimeoutException() {
  return KJ_EXCEPTION(OVERLOADED, "operation timed out");
}